

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_loop_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  _Bool _Var1;
  gtoken_t gVar2;
  gnode_t *pgVar3;
  gnode_t *local_d8;
  gtoken_s local_b8;
  byte local_8b;
  byte local_8a;
  byte local_89;
  undefined1 local_88 [5];
  _Bool is_parenthesize_2;
  _Bool is_parenthesize_1;
  _Bool is_parenthesize;
  gtoken_s end_token;
  gtoken_s token;
  gnode_t *pgStack_30;
  gtoken_t type;
  gnode_t *expr;
  gnode_t *stmt;
  gnode_t *cond;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  stmt = (gnode_t *)0x0;
  expr = (gnode_t *)0x0;
  pgStack_30 = (gnode_t *)0x0;
  gVar2 = gravity_lexer_next(lexer_00);
  gravity_lexer_token((gtoken_s *)&end_token.value,lexer_00);
  if (((gVar2 != TOK_KEY_WHILE) && (gVar2 != TOK_KEY_REPEAT)) && (gVar2 != TOK_KEY_FOR)) {
    __assert_fail("(type == TOK_KEY_WHILE) || (type == TOK_KEY_REPEAT) || (type == TOK_KEY_FOR)",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x8a2,"gnode_t *parse_loop_statement(gravity_parser_t *)");
  }
  if (gVar2 == TOK_KEY_WHILE) {
    local_89 = parse_optional(parser,TOK_OP_OPEN_PARENTHESIS);
    stmt = parse_expression(parser);
    if ((local_89 & 1) != 0) {
      parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
    }
    expr = parse_statement(parser);
  }
  else if (gVar2 == TOK_KEY_REPEAT) {
    expr = parse_statement(parser);
    parse_required(parser,TOK_KEY_WHILE);
    local_8a = parse_optional(parser,TOK_OP_OPEN_PARENTHESIS);
    pgStack_30 = parse_expression(parser);
    if ((local_8a & 1) != 0) {
      parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
    }
    parse_semicolon(parser);
  }
  else if (gVar2 == TOK_KEY_FOR) {
    local_8b = parse_optional(parser,TOK_OP_OPEN_PARENTHESIS);
    gVar2 = gravity_lexer_peek(lexer_00);
    _Var1 = token_isvariable_declaration(gVar2);
    if (_Var1) {
      stmt = parse_variable_declaration(parser,false,TOK_EOF,TOK_EOF);
    }
    else {
      stmt = parse_expression(parser);
    }
    parse_required(parser,TOK_KEY_IN);
    pgStack_30 = parse_expression(parser);
    if ((local_8b & 1) != 0) {
      parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
    }
    expr = parse_statement(parser);
  }
  gravity_lexer_token(&local_b8,lexer_00);
  memcpy(local_88,&local_b8,0x28);
  if (parser->declarations->n == 0) {
    local_d8 = (gnode_t *)0x0;
  }
  else {
    local_d8 = parser->declarations->p[parser->declarations->n - 1];
  }
  token_00.position = token.lineno;
  token_00.colno = token.type;
  token_00._0_8_ = end_token.value;
  token_00._16_8_ = token._8_8_;
  token_00._24_8_ = token._16_8_;
  token_00.value = (char *)token._24_8_;
  pgVar3 = gnode_loop_stat_create
                     (token_00,stmt,expr,pgStack_30,local_d8,
                      (end_token.lineno + end_token.position) - token.lineno);
  return pgVar3;
}

Assistant:

static gnode_t *parse_loop_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_loop_statement");

    // 'while' '(' expression ')' statement
    // 'repeat' statement 'while' '(' expression ')' ';'
    // 'for' '(' condition 'in' expression ')' statement

    DECLARE_LEXER;
    gnode_t        *cond = NULL;
    gnode_t        *stmt = NULL;
    gnode_t        *expr = NULL;

    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    gtoken_s end_token;
    assert((type == TOK_KEY_WHILE) || (type == TOK_KEY_REPEAT)  || (type == TOK_KEY_FOR));

    // 'while' '(' expression ')' statement
    if (type == TOK_KEY_WHILE) {
        // check optional TOK_OP_OPEN_PARENTHESIS
        bool is_parenthesize = parse_optional(parser, TOK_OP_OPEN_PARENTHESIS);

        // parse while condition
        cond = parse_expression(parser);

        // check and consume TOK_OP_CLOSED_PARENTHESIS
        if (is_parenthesize) parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

        // parse while statement
        stmt = parse_statement(parser);

        goto return_node;
    }

    // 'repeat' statement 'while' '(' expression ')' ';'
    if (type == TOK_KEY_REPEAT) {
        // parse repeat statement
        stmt = parse_statement(parser);

        // check and consume TOK_KEY_WHILE
        parse_required(parser, TOK_KEY_WHILE);

        // check optional TOK_OP_OPEN_PARENTHESIS
        bool is_parenthesize = parse_optional(parser, TOK_OP_OPEN_PARENTHESIS);

        // parse while expression
        expr = parse_expression(parser);

        // check and consume TOK_OP_CLOSED_PARENTHESIS
        if (is_parenthesize) parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

        // semicolon
        parse_semicolon(parser);

        goto return_node;
    }

    // 'for' '(' condition 'in' expression ')' statement
    if (type == TOK_KEY_FOR) {
        // check optional TOK_OP_OPEN_PARENTHESIS
        bool is_parenthesize = parse_optional(parser, TOK_OP_OPEN_PARENTHESIS);

        // parse condition (means parse variable declaration or expression)
        if (token_isvariable_declaration(gravity_lexer_peek(lexer))) {
            cond = parse_variable_declaration(parser, false, 0, 0);
        } else {
            cond = parse_expression(parser);
        }

        // check and consume TOK_KEY_IN
        parse_required(parser, TOK_KEY_IN);

        // parse expression
        expr = parse_expression(parser);

        // check and consume TOK_OP_CLOSED_PARENTHESIS
        if (is_parenthesize) parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

        // parse for statement
        stmt = parse_statement(parser);
    }
    
return_node:
    // read current token to extract node total length
    end_token = gravity_lexer_token(lexer);
    
    // return loop node
    return gnode_loop_stat_create(token, cond, stmt, expr, LAST_DECLARATION(), end_token.position + end_token.length - token.position);
}